

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O3

void run_test<unsigned_long>(void)

{
  uint32_t uVar1;
  size_t sVar2;
  char msg [64];
  DivideTest<unsigned_long> local_58;
  char local_48 [64];
  
  snprintf(local_48,0x40,"Testing %s\n","uint64_t");
  sVar2 = strlen(local_48);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_48,sVar2);
  local_58.seed = DivideTest<unsigned_long>::randomSeed();
  uVar1 = DivideTest<unsigned_long>::randomSeed();
  local_58.rand_n = (UT)uVar1;
  DivideTest<unsigned_long>::run(&local_58);
  return;
}

Assistant:

void run_test() {
    char msg[64];
    snprintf(msg, sizeof(msg), "Testing %s\n", type_name<T>::get_name());
    PRINT_INFO(msg);
    DivideTest<T> dt;
    dt.run();
}